

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

PathCommand __thiscall
lunasvg::PathIterator::currentSegment(PathIterator *this,array<lunasvg::Point,_3UL> *points)

{
  reference pvVar1;
  value_type local_4c;
  value_type local_44;
  value_type local_3c;
  value_type local_34;
  value_type local_2c;
  value_type local_24;
  PathCommand local_1c;
  array<lunasvg::Point,_3UL> *paStack_18;
  plutovg_path_command_t command;
  array<lunasvg::Point,_3UL> *points_local;
  PathIterator *this_local;
  
  local_1c = this->m_elements[this->m_index].header.command;
  paStack_18 = points;
  points_local = (array<lunasvg::Point,_3UL> *)this;
  switch(local_1c) {
  case MoveTo:
    Point::Point(&local_24,&this->m_elements[this->m_index + 1].point);
    pvVar1 = std::array<lunasvg::Point,_3UL>::operator[](paStack_18,0);
    *pvVar1 = local_24;
    break;
  case LineTo:
    Point::Point(&local_2c,&this->m_elements[this->m_index + 1].point);
    pvVar1 = std::array<lunasvg::Point,_3UL>::operator[](paStack_18,0);
    *pvVar1 = local_2c;
    break;
  case CubicTo:
    Point::Point(&local_34,&this->m_elements[this->m_index + 1].point);
    pvVar1 = std::array<lunasvg::Point,_3UL>::operator[](paStack_18,0);
    *pvVar1 = local_34;
    Point::Point(&local_3c,&this->m_elements[this->m_index + 2].point);
    pvVar1 = std::array<lunasvg::Point,_3UL>::operator[](paStack_18,1);
    *pvVar1 = local_3c;
    Point::Point(&local_44,&this->m_elements[this->m_index + 3].point);
    pvVar1 = std::array<lunasvg::Point,_3UL>::operator[](paStack_18,2);
    *pvVar1 = local_44;
    break;
  case Close:
    Point::Point(&local_4c,&this->m_elements[this->m_index + 1].point);
    pvVar1 = std::array<lunasvg::Point,_3UL>::operator[](paStack_18,0);
    *pvVar1 = local_4c;
  }
  return local_1c;
}

Assistant:

PathCommand PathIterator::currentSegment(std::array<Point, 3>& points) const
{
    auto command = m_elements[m_index].header.command;
    switch(command) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
        points[0] = m_elements[m_index + 1].point;
        break;
    case PLUTOVG_PATH_COMMAND_LINE_TO:
        points[0] = m_elements[m_index + 1].point;
        break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        points[0] = m_elements[m_index + 1].point;
        points[1] = m_elements[m_index + 2].point;
        points[2] = m_elements[m_index + 3].point;
        break;
    case PLUTOVG_PATH_COMMAND_CLOSE:
        points[0] = m_elements[m_index + 1].point;
        break;
    }

    return PathCommand(command);
}